

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

Maybe<capnp::ClientHook_&> __thiscall capnp::MembraneHook::getResolved(MembraneHook *this)

{
  RefOrVoid<capnp::ClientHook> t;
  ClientHook *pCVar1;
  RefOrVoid<capnp::MembranePolicy> policy;
  Own<capnp::ClientHook,_std::nullptr_t> *t_00;
  long in_RSI;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> local_78 [2];
  RefOrVoid<capnp::ClientHook> local_58;
  ClientHook *result;
  Own<capnp::ClientHook,_std::nullptr_t> newResolved;
  ClientHook *newInner;
  ClientHook *local_30;
  ClientHook *_newInner488;
  Own<capnp::ClientHook,_std::nullptr_t> *r;
  Own<capnp::ClientHook,_std::nullptr_t> *_r484;
  MembraneHook *this_local;
  
  this_local = this;
  _newInner488 = (ClientHook *)
                 kj::_::readMaybe<capnp::ClientHook,decltype(nullptr)>
                           ((Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)(in_RSI + 0x48));
  r = (Own<capnp::ClientHook,_std::nullptr_t> *)_newInner488;
  if (_newInner488 == (ClientHook *)0x0) {
    pCVar1 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->
                       ((Own<capnp::ClientHook,_std::nullptr_t> *)(in_RSI + 0x20));
    (*pCVar1->_vptr_ClientHook[2])(&newInner);
    pCVar1 = kj::_::readMaybe<capnp::ClientHook>((Maybe<capnp::ClientHook_&> *)&newInner);
    local_30 = pCVar1;
    if (pCVar1 == (ClientHook *)0x0) {
      kj::Maybe<capnp::ClientHook_&>::Maybe((Maybe<capnp::ClientHook_&> *)this);
    }
    else {
      newResolved.ptr = pCVar1;
      policy = kj::Own<capnp::MembranePolicy,_std::nullptr_t>::operator*
                         ((Own<capnp::MembranePolicy,_std::nullptr_t> *)(in_RSI + 0x30));
      wrap((MembraneHook *)&result,pCVar1,policy,(bool)(*(byte *)(in_RSI + 0x40) & 1));
      local_58 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator*
                           ((Own<capnp::ClientHook,_std::nullptr_t> *)&result);
      t_00 = kj::mv<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                       ((Own<capnp::ClientHook,_std::nullptr_t> *)&result);
      kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Maybe(local_78,t_00);
      kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::operator=
                ((Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)(in_RSI + 0x48),local_78);
      kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Maybe(local_78);
      kj::Maybe<capnp::ClientHook_&>::Maybe((Maybe<capnp::ClientHook_&> *)this,local_58);
      kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
                ((Own<capnp::ClientHook,_std::nullptr_t> *)&result);
    }
  }
  else {
    t = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator*
                  ((Own<capnp::ClientHook,_std::nullptr_t> *)_newInner488);
    kj::Maybe<capnp::ClientHook_&>::Maybe((Maybe<capnp::ClientHook_&> *)this,t);
  }
  return (Maybe<capnp::ClientHook_&>)&this->super_ClientHook;
}

Assistant:

kj::Maybe<ClientHook&> getResolved() override {
    KJ_IF_SOME(r, resolved) {
      return *r;
    }

    KJ_IF_SOME(newInner, inner->getResolved()) {
      kj::Own<ClientHook> newResolved = wrap(newInner, *policy, reverse);
      ClientHook& result = *newResolved;
      resolved = kj::mv(newResolved);
      return result;
    } else {
      return kj::none;
    }
  }